

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O1

UINT8 __thiscall DROPlayer::Start(DROPlayer *this)

{
  RESMPL_STATE *CAA;
  DEVFUNC_OPTMASK p_Var1;
  PLAYER_EVENT_CB p_Var2;
  UINT8 UVar3;
  pointer puVar4;
  size_t sVar5;
  PLR_DEV_OPTS *pPVar6;
  pointer p_Var7;
  size_t sVar8;
  DEV_GEN_CFG local_48;
  PLR_DEV_OPTS *local_38;
  
  *(undefined4 *)this->_optDevMap = 0xffffffff;
  *(undefined4 *)((long)this->_optDevMap + 4) = 0xffffffff;
  *(undefined4 *)(this->_optDevMap + 1) = 0xffffffff;
  *(undefined4 *)((long)this->_optDevMap + 0xc) = 0xffffffff;
  this->_optDevMap[2] = 0xffffffffffffffff;
  p_Var7 = (this->_devices).super__Vector_base<_dro_chip_device,_std::allocator<_dro_chip_device>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devices).super__Vector_base<_dro_chip_device,_std::allocator<_dro_chip_device>_>.
      _M_impl.super__Vector_impl_data._M_finish != p_Var7) {
    (this->_devices).super__Vector_base<_dro_chip_device,_std::allocator<_dro_chip_device>_>._M_impl
    .super__Vector_impl_data._M_finish = p_Var7;
  }
  std::vector<_dro_chip_device,_std::allocator<_dro_chip_device>_>::resize
            (&this->_devices,
             (long)(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  puVar4 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    local_38 = this->_devOpts;
    sVar8 = 0;
    do {
      p_Var7 = (this->_devices).
               super__Vector_base<_dro_chip_device,_std::allocator<_dro_chip_device>_>._M_impl.
               super__Vector_impl_data._M_start;
      p_Var7[sVar8].base.defInf.dataPtr = (DEV_DATA *)0x0;
      p_Var7[sVar8].base.linkDev = (VGM_BASEDEV *)0x0;
      UVar3 = puVar4[sVar8];
      sVar5 = DeviceID2OptionID(this,(UINT32)sVar8);
      p_Var7[sVar8].optID = sVar5;
      pPVar6 = local_38 + sVar5;
      if (sVar5 == 0xffffffffffffffff) {
        pPVar6 = (PLR_DEV_OPTS *)0x0;
        local_48.emuCore = 0;
        local_48.srMode = '\0';
      }
      else {
        local_48.emuCore = pPVar6->emuCore;
        local_48.srMode = pPVar6->srMode;
      }
      local_48.clock = 0x369e99;
      if (UVar3 == '\f') {
        local_48.clock = 0xda7a64;
      }
      local_48.flags = '\0';
      if ((sVar5 == 0xffffffffffffffff) ||
         (local_48.smplRate = pPVar6->smplRate, local_48.smplRate == 0)) {
        local_48.smplRate = (this->super_PlayerBase)._outSmplRate;
      }
      p_Var7 = p_Var7 + sVar8;
      UVar3 = SndEmu_Start(UVar3,&local_48,(DEV_INFO *)p_Var7);
      if (UVar3 == '\0') {
        SndEmu_GetDeviceFunc((p_Var7->base).defInf.devDef,'\0','\x11',0,&p_Var7->write);
        SetupLinkedDevices(&p_Var7->base,(SETUPLINKDEV_CB)0x0,(void *)0x0);
        if (sVar5 != 0xffffffffffffffff) {
          p_Var1 = ((p_Var7->base).defInf.devDef)->SetOptionBits;
          if (p_Var1 != (DEVFUNC_OPTMASK)0x0) {
            (*p_Var1)((p_Var7->base).defInf.dataPtr,pPVar6->coreOpts);
          }
          this->_optDevMap[p_Var7->optID] = sVar8;
        }
        do {
          p_Var1 = ((p_Var7->base).defInf.devDef)->SetMuteMask;
          if (p_Var1 != (DEVFUNC_OPTMASK)0x0) {
            (*p_Var1)((p_Var7->base).defInf.dataPtr,(pPVar6->muteOpts).chnMute[0]);
          }
          CAA = &(p_Var7->base).resmpl;
          Resmpl_SetVals(CAA,0xff,0x100,(this->super_PlayerBase)._outSmplRate);
          puVar4 = (this->_devPanning).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((puVar4[sVar8] & 2) != 0) {
            (p_Var7->base).resmpl.volumeL = 0;
          }
          if ((puVar4[sVar8] & 1) != 0) {
            (p_Var7->base).resmpl.volumeR = 0;
          }
          Resmpl_DevConnect(CAA,(DEV_INFO *)p_Var7);
          Resmpl_Init(CAA);
          p_Var7 = (pointer)(p_Var7->base).linkDev;
        } while (p_Var7 != (pointer)0x0);
      }
      else {
        (p_Var7->base).defInf.dataPtr = (DEV_DATA *)0x0;
        (p_Var7->base).defInf.devDef = (DEV_DEF *)0x0;
      }
      sVar8 = sVar8 + 1;
      puVar4 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (sVar8 < (ulong)((long)(this->_devTypes).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4));
  }
  this->_playState = this->_playState | 1;
  (*(this->super_PlayerBase)._vptr_PlayerBase[0x1d])(this);
  p_Var2 = (this->super_PlayerBase)._eventCbFunc;
  if (p_Var2 != (PLAYER_EVENT_CB)0x0) {
    (*p_Var2)(&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x01',(void *)0x0);
  }
  return '\0';
}

Assistant:

UINT8 DROPlayer::Start(void)
{
	size_t curDev;
	UINT8 retVal;
	
	for (curDev = 0; curDev < 3; curDev ++)
		_optDevMap[curDev] = (size_t)-1;
	
	_devices.clear();
	_devices.resize(_devTypes.size());
	for (curDev = 0; curDev < _devTypes.size(); curDev ++)
	{
		DRO_CHIPDEV* cDev = &_devices[curDev];
		PLR_DEV_OPTS* devOpts;
		DEV_GEN_CFG devCfg;
		VGM_BASEDEV* clDev;
		UINT8 deviceID;
		
		cDev->base.defInf.dataPtr = NULL;
		cDev->base.linkDev = NULL;
		deviceID = _devTypes[curDev];
		cDev->optID = DeviceID2OptionID(curDev);
		
		devOpts = (cDev->optID != (size_t)-1) ? &_devOpts[cDev->optID] : NULL;
		devCfg.emuCore = (devOpts != NULL) ? devOpts->emuCore : 0x00;
		devCfg.srMode = (devOpts != NULL) ? devOpts->srMode : DEVRI_SRMODE_NATIVE;
		devCfg.flags = 0x00;
		devCfg.clock = 3579545;
		if (deviceID == DEVID_YMF262)
			devCfg.clock *= 4;	// OPL3 uses a 14 MHz clock
		if (devOpts != NULL && devOpts->smplRate)
			devCfg.smplRate = devOpts->smplRate;
		else
			devCfg.smplRate = _outSmplRate;
		
		retVal = SndEmu_Start(deviceID, &devCfg, &cDev->base.defInf);
		if (retVal)
		{
			cDev->base.defInf.dataPtr = NULL;
			cDev->base.defInf.devDef = NULL;
			continue;
		}
		SndEmu_GetDeviceFunc(cDev->base.defInf.devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&cDev->write);
		
		SetupLinkedDevices(&cDev->base, NULL, NULL);
		
		if (devOpts != NULL)
		{
			if (cDev->base.defInf.devDef->SetOptionBits != NULL)
				cDev->base.defInf.devDef->SetOptionBits(cDev->base.defInf.dataPtr, devOpts->coreOpts);
			
			_optDevMap[cDev->optID] = curDev;
		}
		
		for (clDev = &cDev->base; clDev != NULL; clDev = clDev->linkDev)
		{
			if (clDev->defInf.devDef->SetMuteMask != NULL)
				clDev->defInf.devDef->SetMuteMask(clDev->defInf.dataPtr, devOpts->muteOpts.chnMute[0]);
			
			Resmpl_SetVals(&clDev->resmpl, 0xFF, 0x100, _outSmplRate);
			// do DualOPL2 hard panning by muting either the left or right speaker
			if (_devPanning[curDev] & 0x02)
				clDev->resmpl.volumeL = 0x00;
			if (_devPanning[curDev] & 0x01)
				clDev->resmpl.volumeR = 0x00;
			Resmpl_DevConnect(&clDev->resmpl, &clDev->defInf);
			Resmpl_Init(&clDev->resmpl);
		}
	}
	
	_playState |= PLAYSTATE_PLAY;
	Reset();
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_START, NULL);
	
	return 0x00;
}